

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O0

void usage(char *command)

{
  ostream *poVar1;
  char *command_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,command);
  poVar1 = std::operator<<(poVar1," input(s)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void usage(const char* command) {
   cout << "Usage: " << command << " input(s)" << endl;
}